

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

bool makePattern(CHAR8 *textPattern,vector<unsigned_char,_std::allocator<unsigned_char>_> *pattern,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *patternMask)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong __new_size;
  reference pvVar4;
  byte *pbVar5;
  int v2;
  int v1;
  UINTN i;
  UINTN len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *patternMask_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pattern_local;
  CHAR8 *textPattern_local;
  
  sVar3 = strlen(textPattern);
  if ((sVar3 == 0) || ((sVar3 & 1) != 0)) {
    textPattern_local._7_1_ = false;
  }
  else {
    __new_size = sVar3 >> 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pattern,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(patternMask,__new_size);
    for (_v2 = 0; _v2 < __new_size; _v2 = _v2 + 1) {
      iVar1 = toupper((int)textPattern[_v2 * 2]);
      uVar2 = char2hex((char)iVar1);
      iVar1 = toupper((int)textPattern[_v2 * 2 + 1]);
      iVar1 = char2hex((char)iVar1);
      if ((uVar2 == 0xffffffff) || (iVar1 == -1)) {
        return false;
      }
      if (uVar2 != 0xfffffffe) {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (patternMask,_v2);
        *pvVar4 = 0xf0;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pattern,_v2)
        ;
        *pvVar4 = (value_type)((uVar2 & 0xff) << 4);
      }
      if (iVar1 != -2) {
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (patternMask,_v2);
        *pbVar5 = *pbVar5 | 0xf;
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pattern,_v2)
        ;
        *pbVar5 = *pbVar5 | (byte)iVar1;
      }
    }
    textPattern_local._7_1_ = true;
  }
  return textPattern_local._7_1_;
}

Assistant:

bool makePattern(const CHAR8 *textPattern, std::vector<UINT8> &pattern, std::vector<UINT8> &patternMask)
{
    UINTN len = std::strlen(textPattern);
    
    if (len == 0 || len % 2 != 0)
        return false;
    
    len /= 2;
    
    pattern.resize(len);
    patternMask.resize(len);
    
    for (UINTN i = 0; i < len; i++) {
        int v1 = char2hex(std::toupper(textPattern[i * 2]));
        int v2 = char2hex(std::toupper(textPattern[i * 2 + 1]));
        
        if (v1 == -1 || v2 == -1)
            return false;
        
        if (v1 != -2) {
            patternMask[i] = 0xF0;
            pattern[i] = static_cast<UINT8>(v1) << 4;
        }
        
        if (v2 != -2) {
            patternMask[i] |= 0x0F;
            pattern[i] |= static_cast<UINT8>(v2);
        }
    }
    
    return true;
}